

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priolist.c
# Opt level: O1

void nn_priolist_rm(nn_priolist *self,nn_priolist_data *data)

{
  int iVar1;
  nn_list_item *pnVar2;
  nn_list_item *pnVar3;
  nn_priolist_data *pnVar4;
  
  pnVar3 = &data->item;
  iVar1 = nn_list_item_isinlist(pnVar3);
  if (iVar1 != 0) {
    iVar1 = data->priority;
    pnVar4 = self->slots[(long)iVar1 + -1].current;
    pnVar2 = nn_list_erase(&self->slots[(long)iVar1 + -1].pipes,pnVar3);
    if (pnVar4 == data) {
      pnVar4 = (nn_priolist_data *)(pnVar2 + -1);
      if (pnVar2 == (nn_list_item *)0x0) {
        pnVar4 = (nn_priolist_data *)0x0;
      }
      self->slots[(long)iVar1 + -1].current = pnVar4;
      nn_list_item_term(pnVar3);
      if (self->slots[(long)iVar1 + -1].current == (nn_priolist_data *)0x0) {
        pnVar3 = nn_list_begin(&self->slots[(long)iVar1 + -1].pipes);
        pnVar4 = (nn_priolist_data *)(pnVar3 + -1);
        if (pnVar3 == (nn_list_item *)0x0) {
          pnVar4 = (nn_priolist_data *)0x0;
        }
        self->slots[(long)iVar1 + -1].current = pnVar4;
      }
      if (self->current == data->priority) {
        do {
          iVar1 = nn_list_empty(&self->slots[(long)self->current + -1].pipes);
          if (iVar1 == 0) {
            return;
          }
          iVar1 = self->current;
          self->current = iVar1 + 1;
        } while (iVar1 < 0x10);
        self->current = -1;
      }
      return;
    }
  }
  nn_list_item_term(pnVar3);
  return;
}

Assistant:

void nn_priolist_rm (struct nn_priolist *self, struct nn_priolist_data *data)
{
    struct nn_priolist_slot *slot;
    struct nn_list_item *it;

    /*  Non-active pipes don't need any special processing. */
    if (!nn_list_item_isinlist (&data->item)) {
        nn_list_item_term (&data->item);
        return;
    }

    /*  If the pipe being removed is not current, we can simply erase it
        from the list. */
    slot = &self->slots [data->priority - 1];
    if (slot->current != data) {
        nn_list_erase (&slot->pipes, &data->item);
        nn_list_item_term (&data->item);
        return;
    }

    /*  Advance the current pointer (with wrap-over). */
    it = nn_list_erase (&slot->pipes, &data->item);
    slot->current = nn_cont (it, struct nn_priolist_data, item);
    nn_list_item_term (&data->item);
    if (!slot->current) {
        it = nn_list_begin (&slot->pipes);
        slot->current = nn_cont (it, struct nn_priolist_data, item);
    }

    /*  If we are not messing with the current slot, we are done. */
    if (self->current != data->priority)
        return;

    /*  Otherwise, the current slot may have become empty and we have switch
        to lower priority slots. */
    while (nn_list_empty (&self->slots [self->current - 1].pipes)) {
        ++self->current;
        if (self->current > NN_PRIOLIST_SLOTS) {
            self->current = -1;
            return;
        }
    }
}